

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall Jupiter::Socket::peekFrom(Socket *this,addrinfo *info)

{
  Data *pDVar1;
  int iVar2;
  sockaddr *psVar3;
  ssize_t sVar4;
  socklen_t len;
  socklen_t local_1c;
  
  pDVar1 = this->m_data;
  (pDVar1->buffer).m_buffer_size = 0;
  if (info == (addrinfo *)0x0) {
    sVar4 = recvfrom(pDVar1->rawSock,(pDVar1->buffer).m_buffer,(pDVar1->buffer).m_buffer_capacity,2,
                     (sockaddr *)0x0,(socklen_t *)0x0);
    iVar2 = (int)sVar4;
  }
  else {
    local_1c = info->ai_addrlen;
    if (local_1c == 0) {
      psVar3 = (sockaddr *)operator_new(0x10);
      psVar3->sa_family = 0;
      psVar3->sa_data[0] = '\0';
      psVar3->sa_data[1] = '\0';
      psVar3->sa_data[2] = '\0';
      psVar3->sa_data[3] = '\0';
      psVar3->sa_data[4] = '\0';
      psVar3->sa_data[5] = '\0';
      psVar3->sa_data[6] = '\0';
      psVar3->sa_data[7] = '\0';
      psVar3->sa_data[8] = '\0';
      psVar3->sa_data[9] = '\0';
      psVar3->sa_data[10] = '\0';
      psVar3->sa_data[0xb] = '\0';
      psVar3->sa_data[0xc] = '\0';
      psVar3->sa_data[0xd] = '\0';
      info->ai_addr = psVar3;
      local_1c = 0x10;
    }
    sVar4 = recvfrom(pDVar1->rawSock,(pDVar1->buffer).m_buffer,(pDVar1->buffer).m_buffer_capacity,2,
                     (sockaddr *)info->ai_addr,&local_1c);
    iVar2 = (int)sVar4;
    if (-1 < iVar2) {
      info->ai_addrlen = local_1c;
      info->ai_family = (uint)info->ai_addr->sa_family;
      pDVar1 = this->m_data;
      info->ai_protocol = pDVar1->sockProto;
      info->ai_socktype = pDVar1->sockType;
    }
  }
  return iVar2;
}

Assistant:

int Jupiter::Socket::peekFrom(addrinfo *info) {
	m_data->buffer.clear();
	if (info == nullptr)
		return recvfrom(m_data->rawSock, m_data->buffer.chr_data(), m_data->buffer.capacity(), MSG_PEEK, nullptr, nullptr);

	socklen_t len = info->ai_addrlen;
	if (len <= 0) {
		info->ai_addr = new sockaddr();
		len = sizeof(sockaddr);
	}
	int r = recvfrom(m_data->rawSock, m_data->buffer.chr_data(), m_data->buffer.capacity(), MSG_PEEK, info->ai_addr, &len);
	if (r >= 0) {
		info->ai_addrlen = len;
		info->ai_family = info->ai_addr->sa_family;
		info->ai_protocol = Jupiter::Socket::getProtocol();
		info->ai_socktype = Jupiter::Socket::getType();
	}
	return r;
}